

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

lws * lws_client_connect_via_info(lws_client_connect_info *i)

{
  void *pvVar1;
  uint16_t uVar2;
  int iVar3;
  lws_log_cx *plVar4;
  char *pcVar5;
  undefined4 uVar6;
  lws *plVar7;
  char *local_d8;
  char *local_b8;
  char *local_90;
  char *cce;
  int n;
  int tsi;
  lws_vhost *vh;
  char *cisin [8];
  lws_protocols *p;
  lws *safe;
  lws *wsi;
  char *local;
  lws_client_connect_info *i_local;
  
  wsi = (lws *)i->protocol;
  p = (lws_protocols *)0x0;
  if ((*(ushort *)&i->context->field_0x7b7 >> 5 & 1) != 0) {
    return (lws *)0x0;
  }
  if (((*(ushort *)&i->context->field_0x7b7 >> 6 & 1) == 0) &&
     (iVar3 = lws_protocol_init(i->context), iVar3 != 0)) {
    return (lws *)0x0;
  }
  if (i->local_protocol_name != (char *)0x0) {
    wsi = (lws *)i->local_protocol_name;
  }
  cce._4_4_ = lws_pthread_self_to_tsi(i->context);
  if (cce._4_4_ < 0) {
    __assert_fail("tsi >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/client/connect.c"
                  ,0x9d,
                  "struct lws *lws_client_connect_via_info(const struct lws_client_connect_info *)")
    ;
  }
  safe = __lws_wsi_create_with_role(i->context,cce._4_4_,(lws_role_ops *)0x0,i->log_cx);
  if (safe == (lws *)0x0) {
    return (lws *)0x0;
  }
  _n = i->vhost;
  if (_n == (lws_vhost *)0x0) {
    _n = i->context->vhost_list;
    if (_n != (lws_vhost *)0x0) {
      iVar3 = strcmp(_n->name,"system");
      if (iVar3 == 0) {
        _n = _n->vhost_next;
      }
      goto LAB_0015a36e;
    }
    plVar4 = lwsl_context_get_cx(i->context);
    _lws_log_cx(plVar4,lws_log_prepend_context,i->context,1,"lws_client_connect_via_info","no vhost"
               );
  }
  else {
LAB_0015a36e:
    *(ulong *)&safe->field_0x46e =
         *(ulong *)&safe->field_0x46e & 0x7fffffffffffffff | 0x8000000000000000;
    if (i->keep_warm_secs == 0) {
      safe->keep_warm_secs = 5;
    }
    else {
      safe->keep_warm_secs = i->keep_warm_secs;
    }
    safe->seq = i->seq;
    safe->flags = i->ssl_connection;
    safe->c_pri = i->priority;
    if (i->retry_and_idle_policy == (lws_retry_bo_t *)0x0) {
      safe->retry_policy = &i->context->default_retry;
    }
    else {
      safe->retry_policy = i->retry_and_idle_policy;
    }
    if ((i->ssl_connection & 0x80000U) != 0) {
      *(ulong *)&safe->field_0x46e =
           *(ulong *)&safe->field_0x46e & 0xfffff7ffffffffff | 0x80000000000;
    }
    lws_vhost_bind_wsi(_n,safe);
    if ((safe->a).vhost == (lws_vhost *)0x0) {
      plVar4 = lwsl_wsi_get_cx(safe);
      _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,1,"lws_client_connect_via_info",
                  "No vhost in the context");
    }
    else {
      iVar3 = lws_role_call_client_bind(safe,i);
      if (iVar3 < 0) {
        plVar4 = lwsl_wsi_get_cx(safe);
        _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,1,"lws_client_connect_via_info",
                    "unable to bind to role");
      }
      else {
        plVar4 = lwsl_wsi_get_cx(safe);
        _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,8,"lws_client_connect_via_info",
                    "role binding to %s",safe->role_ops->name);
        safe->user_space = (void *)0x0;
        safe->pending_timeout = '\0';
        safe->position_in_fds_table = -1;
        uVar2 = (uint16_t)i->port;
        safe->c_port = uVar2;
        safe->ocport = uVar2;
        safe->sys_tls_client_cert = i->sys_tls_client_cert;
        (safe->txc).manual_initial_tx_credit = i->manual_initial_tx_credit;
        (safe->a).protocol = ((safe->a).vhost)->protocols;
        *(ulong *)&safe->field_0x46e =
             *(ulong *)&safe->field_0x46e & 0xfdffffffffffffff |
             (ulong)((i->ssl_connection & 0x10000U) != 0) << 0x39;
        *(ulong *)&safe->field_0x46e =
             *(ulong *)&safe->field_0x46e & 0xbfffffffffffffff |
             (ulong)((i->ssl_connection & 0x1000U) != 0) << 0x3e;
        if (i->userdata != (void *)0x0) {
          *(ulong *)&safe->field_0x46e = *(ulong *)&safe->field_0x46e & 0xfffffffffffff7ff | 0x800;
          safe->user_space = i->userdata;
        }
        if (wsi != (lws *)0x0) {
          plVar4 = lwsl_wsi_get_cx(safe);
          plVar7 = wsi;
          _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,8,"lws_client_connect_via_info",
                      "vh %s protocol binding to %s\n",((safe->a).vhost)->name,wsi);
          cisin[7] = (char *)lws_vhost_name_to_protocol((safe->a).vhost,(char *)wsi);
          if ((lws_protocols *)cisin[7] == (lws_protocols *)0x0) {
            plVar4 = lwsl_wsi_get_cx(safe);
            _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,8,"lws_client_connect_via_info",
                        "unknown protocol %s",wsi,plVar7);
          }
          else {
            lws_bind_protocol(safe,(lws_protocols *)cisin[7],"lws_client_connect_via_info");
          }
          plVar4 = lwsl_wsi_get_cx(safe);
          pcVar5 = lws_wsi_tag(safe);
          if ((safe->a).protocol == (lws_protocols *)0x0) {
            local_b8 = "none";
          }
          else {
            local_b8 = ((safe->a).protocol)->name;
          }
          _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,8,"lws_client_connect_via_info",
                      "%s: %s %s entry",pcVar5,safe->role_ops->name,local_b8);
        }
        if ((safe->user_space == (void *)0x0) && (i->userdata != (void *)0x0)) {
          *(ulong *)&safe->field_0x46e = *(ulong *)&safe->field_0x46e & 0xfffffffffffff7ff | 0x800;
          safe->user_space = i->userdata;
        }
        (safe->tls).use_ssl = i->ssl_connection;
        vh = (lws_vhost *)i->address;
        cisin[0] = i->path;
        cisin[1] = i->host;
        cisin[2] = i->origin;
        cisin[3] = i->protocol;
        cisin[4] = i->method;
        cisin[5] = i->iface;
        cisin[6] = i->alpn;
        iVar3 = lws_client_stash_create(safe,(char **)&vh);
        if (iVar3 == 0) {
          if (i->alpn != (char *)0x0) {
            lws_strncpy(safe->alpn,i->alpn,0x18);
          }
          pvVar1 = i->opaque_user_data;
          safe->stash->opaque_user_data = pvVar1;
          (safe->a).opaque_user_data = pvVar1;
          if (i->method == (char *)0x0) {
            local_d8 = "WS";
          }
          else {
            local_d8 = i->method;
          }
          pcVar5 = i->address;
          __lws_lc_tag(i->context,i->context->lcg + 4,&safe->lc,"%s/%s/%s",local_d8,
                       safe->role_ops->name,pcVar5);
          uVar6 = (undefined4)((ulong)pcVar5 >> 0x20);
          if (i->parent_wsi != (lws *)0x0) {
            plVar4 = lwsl_wsi_get_cx(safe);
            pcVar5 = lws_wsi_tag(i->parent_wsi);
            _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,8,"lws_client_connect_via_info",
                        "created as child %s",pcVar5);
            uVar6 = (undefined4)((ulong)pcVar5 >> 0x20);
            safe->parent = i->parent_wsi;
            p = (lws_protocols *)i->parent_wsi->child_list;
            safe->sibling_list = (lws *)p;
            i->parent_wsi->child_list = safe;
          }
          if ((int)(uint)safe->role_ops->rops_idx[9] >> 4 == 0) {
LAB_0015ab62:
            if (i->pwsi != (lws **)0x0) {
              *i->pwsi = safe;
            }
            if ((safe->role_ops != &role_ops_raw_skt) ||
               ((i->local_protocol_name != (char *)0x0 &&
                (iVar3 = strcmp(i->local_protocol_name,"raw-proxy"), iVar3 == 0)))) {
              plVar4 = lwsl_wsi_get_cx(safe);
              _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,0x10,"lws_client_connect_via_info",
                          "adoption cb %d to %s %s",
                          CONCAT44(uVar6,(uint)safe->role_ops->adoption_cb[0]),safe->role_ops->name,
                          ((safe->a).protocol)->name);
              (*((safe->a).protocol)->callback)
                        (safe,(uint)safe->role_ops->adoption_cb[0],safe->user_space,(void *)0x0,0);
            }
            if ((i->method != (char *)0x0) && (iVar3 = strcmp(i->method,"RAW"), iVar3 == 0)) {
              (safe->tls).ssl = (lws_tls_conn *)0x0;
              if (((safe->tls).use_ssl & 1) != 0) {
                local_90 = (char *)0x0;
                iVar3 = lws_client_create_tls(safe,&local_90,1);
                if (iVar3 != 0) {
                  if (iVar3 == 1) {
                    return safe;
                  }
                  plVar4 = lwsl_wsi_get_cx(safe);
                  _lws_log_cx(plVar4,lws_log_prepend_wsi,safe,8,"lws_client_connect_via_info",
                              "tls start fail");
                  lws_close_free_wsi(safe,LWS_CLOSE_STATUS_NOSTATUS,"tls start fail");
                  if (i->pwsi != (lws **)0x0) {
                    *i->pwsi = (lws *)0x0;
                  }
                  return (lws *)0x0;
                }
              }
              safe = lws_http_client_connect_via_info2(safe);
            }
            if (safe != (lws *)0x0) {
              *(ulong *)&safe->field_0x46e = *(ulong *)&safe->field_0x46e & 0x7fffffffffffffff;
            }
            return safe;
          }
          cce._0_4_ = (*safe->role_ops->rops_table
                        [((int)(uint)safe->role_ops->rops_idx[9] >> 4) + -1].check_upgrades)(safe);
          if (((int)cce != 0) && (i->parent_wsi != (lws *)0x0)) {
            i->parent_wsi->child_list = (lws *)p;
          }
          if ((int)cce < 0) goto LAB_0015ae12;
          if ((int)cce == 0) {
            cce._0_4_ = 0;
            goto LAB_0015ab62;
          }
        }
      }
    }
  }
  if (((safe->tls).ssl != (lws_tls_conn *)0x0) && ((*(ulong *)&safe->field_0x46e >> 0x30 & 1) != 0))
  {
    lws_tls_restrict_return(i->context);
  }
  lws_realloc(safe->stash,0,"free");
  safe->stash = (client_info_stash *)0x0;
  lws_realloc(safe,0,"lws_free");
LAB_0015ae12:
  if (i->pwsi != (lws **)0x0) {
    *i->pwsi = (lws *)0x0;
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_client_connect_via_info(const struct lws_client_connect_info *i)
{
	const char *local = i->protocol;
	struct lws *wsi, *safe = NULL;
	const struct lws_protocols *p;
	const char *cisin[CIS_COUNT];
	struct lws_vhost *vh;
	int tsi;

	if (i->context->requested_stop_internal_loops)
		return NULL;

	if (!i->context->protocol_init_done)
		if (lws_protocol_init(i->context))
			return NULL;

	/*
	 * If we have .local_protocol_name, use it to select the local protocol
	 * handler to bind to.  Otherwise use .protocol if http[s].
	 */
	if (i->local_protocol_name)
		local = i->local_protocol_name;

	lws_context_lock(i->context, __func__);
	/*
	 * PHASE 1: if SMP, find out the tsi related to current service thread
	 */

	tsi = lws_pthread_self_to_tsi(i->context);
	assert(tsi >= 0);

	/* PHASE 2: create a bare wsi */

	wsi = __lws_wsi_create_with_role(i->context, tsi, NULL, i->log_cx);
	lws_context_unlock(i->context);
	if (wsi == NULL)
		return NULL;

	vh = i->vhost;
	if (!vh) {
#if defined(LWS_WITH_TLS_JIT_TRUST)
		if (lws_tls_jit_trust_vhost_bind(i->context, i->address, &vh))
#endif
		{
			vh = i->context->vhost_list;

			if (!vh) { /* coverity */
				lwsl_cx_err(i->context, "no vhost");
				goto bail;
			}
			if (!strcmp(vh->name, "system"))
				vh = vh->vhost_next;
		}
	}

#if defined(LWS_WITH_SECURE_STREAMS)
	/* any of these imply we are a client wsi bound to an SS, which
	 * implies our opaque user ptr is the ss (or sspc if PROXY_LINK) handle
	 */
	wsi->for_ss = !!(i->ssl_connection & (LCCSCF_SECSTREAM_CLIENT | LCCSCF_SECSTREAM_PROXY_LINK | LCCSCF_SECSTREAM_PROXY_ONWARD));
	wsi->client_bound_sspc = !!(i->ssl_connection & LCCSCF_SECSTREAM_PROXY_LINK); /* so wsi close understands need to remove sspc ptr to wsi */
	wsi->client_proxy_onward = !!(i->ssl_connection & LCCSCF_SECSTREAM_PROXY_ONWARD);
#endif

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	wsi->fic.name = "wsi";
	if (i->fic.fi_owner.count)
		/*
		 * This moves all the lws_fi_t from i->fi to the vhost fi,
		 * leaving it empty
		 */
		lws_fi_import(&wsi->fic, &i->fic);

	lws_fi_inherit_copy(&wsi->fic, &i->context->fic, "wsi", i->fi_wsi_name);

	if (lws_fi(&wsi->fic, "createfail"))
		goto bail;

#if defined(LWS_WITH_SECURE_STREAMS)
#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
	if (wsi->client_bound_sspc) {
		lws_sspc_handle_t *fih = (lws_sspc_handle_t *)i->opaque_user_data;
		lws_fi_inherit_copy(&wsi->fic, &fih->fic, "wsi", NULL);
	}
#endif
	if (wsi->for_ss) {
		lws_ss_handle_t *fih = (lws_ss_handle_t *)i->opaque_user_data;
		lws_fi_inherit_copy(&wsi->fic, &fih->fic, "wsi", NULL);
	}
#endif
#endif

	lws_wsi_fault_timedclose(wsi);

	/*
	 * Until we exit, we can report connection failure directly to the
	 * caller without needing to call through to protocol CONNECTION_ERROR.
	 */
	wsi->client_suppress_CONNECTION_ERROR = 1;

	if (i->keep_warm_secs)
		wsi->keep_warm_secs = i->keep_warm_secs;
	else
		wsi->keep_warm_secs = 5;

	wsi->seq = i->seq;
	wsi->flags = i->ssl_connection;

	wsi->c_pri = i->priority;

	if (i->retry_and_idle_policy)
		wsi->retry_policy = i->retry_and_idle_policy;
	else
		wsi->retry_policy = &i->context->default_retry;

	if (i->ssl_connection & LCCSCF_WAKE_SUSPEND__VALIDITY)
		wsi->conn_validity_wakesuspend = 1;

	lws_vhost_bind_wsi(vh, wsi);

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	/* additionally inerit from vhost we bound to */
	lws_fi_inherit_copy(&wsi->fic, &vh->fic, "wsi", i->fi_wsi_name);
#endif

	if (!wsi->a.vhost) {
		lwsl_wsi_err(wsi, "No vhost in the context");

		goto bail;
	}

	/*
	 * PHASE 3: Choose an initial role for the wsi and do role-specific init
	 *
	 * Note the initial role may not reflect the final role, eg,
	 * we may want ws, but first we have to go through h1 to get that
	 */

	if (lws_role_call_client_bind(wsi, i) < 0) {
		lwsl_wsi_err(wsi, "unable to bind to role");

		goto bail;
	}
	lwsl_wsi_info(wsi, "role binding to %s", wsi->role_ops->name);

	/*
	 * PHASE 4: fill up the wsi with stuff from the connect_info as far as
	 * it can go.  It's uncertain because not only is our connection
	 * going to complete asynchronously, we might have bound to h1 and not
	 * even be able to get ahold of an ah immediately.
	 */

	wsi->user_space = NULL;
	wsi->pending_timeout = NO_PENDING_TIMEOUT;
	wsi->position_in_fds_table = LWS_NO_FDS_POS;
	wsi->ocport = wsi->c_port = (uint16_t)(unsigned int)i->port;
	wsi->sys_tls_client_cert = i->sys_tls_client_cert;

#if defined(LWS_ROLE_H2)
	wsi->txc.manual_initial_tx_credit =
			(int32_t)i->manual_initial_tx_credit;
#endif

	wsi->a.protocol = &wsi->a.vhost->protocols[0];
	wsi->client_pipeline = !!(i->ssl_connection & LCCSCF_PIPELINE);
	wsi->client_no_follow_redirect = !!(i->ssl_connection &
					    LCCSCF_HTTP_NO_FOLLOW_REDIRECT);

	/*
	 * PHASE 5: handle external user_space now, generic alloc is done in
	 * role finalization
	 */

	if (i->userdata) {
		wsi->user_space_externally_allocated = 1;
		wsi->user_space = i->userdata;
	}

	if (local) {
		lwsl_wsi_info(wsi, "vh %s protocol binding to %s\n",
				wsi->a.vhost->name, local);
		p = lws_vhost_name_to_protocol(wsi->a.vhost, local);
		if (p)
			lws_bind_protocol(wsi, p, __func__);
		else
			lwsl_wsi_info(wsi, "unknown protocol %s", local);

		lwsl_wsi_info(wsi, "%s: %s %s entry",
			    lws_wsi_tag(wsi), wsi->role_ops->name,
			    wsi->a.protocol ? wsi->a.protocol->name : "none");
	}

	/*
	 * PHASE 5: handle external user_space now, generic alloc is done in
	 * role finalization
	 */

	if (!wsi->user_space && i->userdata) {
		wsi->user_space_externally_allocated = 1;
		wsi->user_space = i->userdata;
	}

#if defined(LWS_WITH_TLS)
	wsi->tls.use_ssl = (unsigned int)i->ssl_connection;
#else
	if (i->ssl_connection & LCCSCF_USE_SSL) {
		lwsl_wsi_err(wsi, "lws not configured for tls");
		goto bail;
	}
#endif

	/*
	 * PHASE 6: stash the things from connect_info that we can't process
	 * right now, eg, if http binding, without an ah.  If h1 and no ah, we
	 * will go on the ah waiting list and process those things later (after
	 * the connect_info and maybe the things pointed to have gone out of
	 * scope)
	 *
	 * However these things are stashed in a generic way at this point,
	 * with no relationship to http or ah
	 */

	cisin[CIS_ADDRESS]	= i->address;
	cisin[CIS_PATH]		= i->path;
	cisin[CIS_HOST]		= i->host;
	cisin[CIS_ORIGIN]	= i->origin;
	cisin[CIS_PROTOCOL]	= i->protocol;
	cisin[CIS_METHOD]	= i->method;
	cisin[CIS_IFACE]	= i->iface;
	cisin[CIS_ALPN]		= i->alpn;

	if (lws_client_stash_create(wsi, cisin))
		goto bail;

#if defined(LWS_WITH_TLS)
	if (i->alpn)
		lws_strncpy(wsi->alpn, i->alpn, sizeof(wsi->alpn));
#endif

	wsi->a.opaque_user_data = wsi->stash->opaque_user_data =
		i->opaque_user_data;

#if defined(LWS_WITH_SECURE_STREAMS)

	if (wsi->for_ss) {
		/* it's related to ss... the options are
		 *
		 * LCCSCF_SECSTREAM_PROXY_LINK  : client SSPC link to proxy
		 * LCCSCF_SECSTREAM_PROXY_ONWARD: proxy's onward connection
		 */
		__lws_lc_tag(i->context, &i->context->lcg[
#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
		         i->ssl_connection & LCCSCF_SECSTREAM_PROXY_LINK ? LWSLCG_WSI_SSP_CLIENT :
#if defined(LWS_WITH_SERVER)
		         (i->ssl_connection & LCCSCF_SECSTREAM_PROXY_ONWARD ? LWSLCG_WSI_SSP_ONWARD :
#endif
			  LWSLCG_WSI_CLIENT
#if defined(LWS_WITH_SERVER)
			  )
#endif
		],
#else
				LWSLCG_WSI_CLIENT],
#endif
			&wsi->lc, "%s/%s/%s/(%s)", i->method ? i->method : "WS",
			wsi->role_ops->name, i->address,
#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
			wsi->client_bound_sspc ?
				lws_sspc_tag((lws_sspc_handle_t *)i->opaque_user_data) :
#endif
			lws_ss_tag(((lws_ss_handle_t *)i->opaque_user_data)));
	} else
#endif
		__lws_lc_tag(i->context, &i->context->lcg[LWSLCG_WSI_CLIENT], &wsi->lc,
			     "%s/%s/%s", i->method ? i->method : "WS",
			     wsi->role_ops->name, i->address);

	lws_metrics_tag_wsi_add(wsi, "vh", wsi->a.vhost->name);

	/*
	 * at this point user callbacks like
	 * LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER will be interested to
	 * know the parent... eg for proxying we can grab extra headers from
	 * the parent's incoming ah and add them to the child client handshake
	 */

	if (i->parent_wsi) {
		lwsl_wsi_info(wsi, "created as child %s",
			      lws_wsi_tag(i->parent_wsi));
		wsi->parent = i->parent_wsi;
		safe = wsi->sibling_list = i->parent_wsi->child_list;
		i->parent_wsi->child_list = wsi;
	}

	/*
	 * PHASE 7: Do any role-specific finalization processing.  We can still
	 * see important info things via wsi->stash
	 */

	if (lws_rops_fidx(wsi->role_ops, LWS_ROPS_client_bind)) {

		int n = lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_client_bind).
							client_bind(wsi, NULL);

		if (n && i->parent_wsi)
			/* unpick from parent */
			i->parent_wsi->child_list = safe;

		if (n < 0)
			/* we didn't survive, wsi is freed */
			goto bail2;

		if (n)
			/* something else failed, wsi needs freeing */
			goto bail;
	}

	/* let the caller's optional wsi storage have the wsi we created */

	if (i->pwsi)
		*i->pwsi = wsi;

	/* PHASE 8: notify protocol with role-specific connected callback */

	/* raw socket per se doesn't want this... raw socket proxy wants it... */

	if (wsi->role_ops != &role_ops_raw_skt ||
	    (i->local_protocol_name &&
	     !strcmp(i->local_protocol_name, "raw-proxy"))) {
		lwsl_wsi_debug(wsi, "adoption cb %d to %s %s",
			   wsi->role_ops->adoption_cb[0],
			   wsi->role_ops->name, wsi->a.protocol->name);

		wsi->a.protocol->callback(wsi, wsi->role_ops->adoption_cb[0],
				wsi->user_space, NULL, 0);
	}

#if defined(LWS_WITH_HUBBUB)
	if (i->uri_replace_to)
		wsi->http.rw = lws_rewrite_create(wsi, html_parser_cb,
					     i->uri_replace_from,
					     i->uri_replace_to);
#endif

	if (i->method && (!strcmp(i->method, "RAW") // ||
//			  !strcmp(i->method, "MQTT")
	)) {

		/*
		 * Not for MQTT here, since we don't know if we will
		 * pipeline it or not...
		 */

#if defined(LWS_WITH_TLS)

		wsi->tls.ssl = NULL;

		if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
			const char *cce = NULL;

			switch (
#if !defined(LWS_WITH_SYS_ASYNC_DNS)
			lws_client_create_tls(wsi, &cce, 1)
#else
			lws_client_create_tls(wsi, &cce, 0)
#endif
			) {
			case 1:
				return wsi;
			case 0:
				break;
			default:
				goto bail3;
			}
		}
#endif


		/* fallthru */

		wsi = lws_http_client_connect_via_info2(wsi);
	}

	if (wsi)
		/*
		 * If it subsequently fails, report CONNECTION_ERROR,
		 * because we're going to return a non-error return now.
		 */
		wsi->client_suppress_CONNECTION_ERROR = 0;

	return wsi;

#if defined(LWS_WITH_TLS)
bail3:
	lwsl_wsi_info(wsi, "tls start fail");
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "tls start fail");

	if (i->pwsi)
		*i->pwsi = NULL;

	return NULL;
#endif

bail:
#if defined(LWS_WITH_TLS)
	if (wsi->tls.ssl && wsi->tls_borrowed)
		lws_tls_restrict_return(i->context);
#endif

	lws_free_set_NULL(wsi->stash);
	lws_fi_destroy(&wsi->fic);
	lws_free(wsi);
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
bail2:
#endif

	if (i->pwsi)
		*i->pwsi = NULL;

	return NULL;
}